

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__platform_loop_delete(uv_loop_t *loop)

{
  void *pvVar1;
  
  pvVar1 = loop->internal_fields;
  uv__iou_delete((uv__iou *)((long)pvVar1 + 200));
  uv__iou_delete((uv__iou *)((long)pvVar1 + 0x150));
  if (loop->inotify_fd != -1) {
    uv__io_stop(loop,&loop->inotify_read_watcher,1);
    uv__close(loop->inotify_fd);
    loop->inotify_fd = -1;
  }
  return;
}

Assistant:

void uv__platform_loop_delete(uv_loop_t* loop) {
  uv__loop_internal_fields_t* lfields;

  lfields = uv__get_internal_fields(loop);
  uv__iou_delete(&lfields->ctl);
  uv__iou_delete(&lfields->iou);

  if (loop->inotify_fd != -1) {
    uv__io_stop(loop, &loop->inotify_read_watcher, POLLIN);
    uv__close(loop->inotify_fd);
    loop->inotify_fd = -1;
  }
}